

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int EmitRescaledRGB(VP8Io *io,WebPDecParams *p)

{
  int iVar1;
  WebPDecBuffer *pWVar2;
  WebPYUV444Converter p_Var3;
  WebPRescaler *wrk;
  WebPRescaler *pWVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int max_num_lines;
  int iVar8;
  int iVar9;
  uint8_t *puVar10;
  
  iVar1 = io->mb_h;
  iVar7 = 0;
  iVar9 = 0;
  iVar8 = 0;
  while (iVar1 - iVar8 != 0 && iVar8 <= iVar1) {
    iVar5 = WebPRescalerImport(p->scaler_y,iVar1 - iVar8,io->y + (long)iVar8 * (long)io->y_stride,
                               io->y_stride);
    max_num_lines = (iVar1 + 1 >> 1) - iVar9;
    iVar6 = WebPRescaleNeededLines(p->scaler_u,max_num_lines);
    if (iVar6 != 0) {
      iVar6 = WebPRescalerImport(p->scaler_u,max_num_lines,io->u + (long)io->uv_stride * (long)iVar9
                                 ,io->uv_stride);
      WebPRescalerImport(p->scaler_v,max_num_lines,io->v + (long)io->uv_stride * (long)iVar9,
                         io->uv_stride);
      iVar9 = iVar9 + iVar6;
    }
    iVar8 = iVar8 + iVar5;
    pWVar2 = p->output;
    p_Var3 = WebPYUV444Converters[pWVar2->colorspace];
    puVar10 = (pWVar2->u).RGBA.rgba +
              (long)(pWVar2->u).RGBA.stride * ((long)iVar7 + (long)p->last_y);
    while ((((wrk = p->scaler_y, wrk->dst_y < wrk->dst_height && (wrk->y_accum < 1)) &&
            (pWVar4 = p->scaler_u, pWVar4->dst_y < pWVar4->dst_height)) && (pWVar4->y_accum < 1))) {
      WebPRescalerExportRow(wrk);
      WebPRescalerExportRow(p->scaler_u);
      WebPRescalerExportRow(p->scaler_v);
      (*p_Var3)(p->scaler_y->dst,p->scaler_u->dst,p->scaler_v->dst,puVar10,p->scaler_y->dst_width);
      puVar10 = puVar10 + (pWVar2->u).RGBA.stride;
      iVar7 = iVar7 + 1;
    }
  }
  return iVar7;
}

Assistant:

static int EmitRescaledRGB(const VP8Io* const io, WebPDecParams* const p) {
  const int mb_h = io->mb_h;
  const int uv_mb_h = (mb_h + 1) >> 1;
  int j = 0, uv_j = 0;
  int num_lines_out = 0;
  while (j < mb_h) {
    const int y_lines_in =
        WebPRescalerImport(p->scaler_y, mb_h - j,
                           io->y + (ptrdiff_t)j * io->y_stride, io->y_stride);
    j += y_lines_in;
    if (WebPRescaleNeededLines(p->scaler_u, uv_mb_h - uv_j)) {
      const int u_lines_in = WebPRescalerImport(
          p->scaler_u, uv_mb_h - uv_j, io->u + (ptrdiff_t)uv_j * io->uv_stride,
          io->uv_stride);
      const int v_lines_in = WebPRescalerImport(
          p->scaler_v, uv_mb_h - uv_j, io->v + (ptrdiff_t)uv_j * io->uv_stride,
          io->uv_stride);
      (void)v_lines_in;   // remove a gcc warning
      assert(u_lines_in == v_lines_in);
      uv_j += u_lines_in;
    }
    num_lines_out += ExportRGB(p, p->last_y + num_lines_out);
  }
  return num_lines_out;
}